

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScenePrivate::QGraphicsScenePrivate(QGraphicsScenePrivate *this)

{
  QObjectPrivate *in_RDI;
  
  QObjectPrivate::QObjectPrivate(in_RDI,QObjectPrivateVersion);
  *(undefined ***)in_RDI = &PTR__QGraphicsScenePrivate_00d344d0;
  *(undefined4 *)(in_RDI + 0x84) = 0;
  *(undefined8 *)(in_RDI + 0x88) = 0;
  *(undefined4 *)(in_RDI + 0x90) = 0;
  QRectF::QRectF((QRectF *)(in_RDI + 0x98));
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffffffe;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffffffd | 2;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffffffb;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffffff7;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xffffffef;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xffffffdf | 0x20;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xffffffbf;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xffffff7f | 0x80;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffffeff;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffffdff;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffffbff;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffff7ff;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xffffefff | 0x1000;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xffffdfff | 0x2000;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xffffbfff | 0x4000;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xffff7fff;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffeffff | 0x10000;
  *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffdffff | 0x20000;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  QRectF::QRectF((QRectF *)(in_RDI + 200));
  std::set<QRectF,_QGraphicsScenePrivate::UpdatedRectsCmp,_std::allocator<QRectF>_>::set
            ((set<QRectF,_QGraphicsScenePrivate::UpdatedRectsCmp,_std::allocator<QRectF>_> *)
             0x9bfe62);
  QPainterPath::QPainterPath((QPainterPath *)(in_RDI + 0x118));
  *(undefined4 *)(in_RDI + 0x120) = 0;
  QSet<QGraphicsItem_*>::QSet((QSet<QGraphicsItem_*> *)0x9bfe8e);
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x9bfe9f);
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x9bfeb0);
  QHash<QGraphicsItem_*,_QPointF>::QHash((QHash<QGraphicsItem_*,_QPointF> *)(in_RDI + 0x160));
  QSet<QGraphicsItem_*>::QSet((QSet<QGraphicsItem_*> *)0x9bfed2);
  QBrush::QBrush((QBrush *)(in_RDI + 0x170));
  QBrush::QBrush((QBrush *)(in_RDI + 0x178));
  *(undefined4 *)(in_RDI + 0x180) = 2;
  *(undefined8 *)(in_RDI + 0x188) = 0;
  *(undefined8 *)(in_RDI + 400) = 0;
  *(undefined8 *)(in_RDI + 0x198) = 0;
  *(undefined8 *)(in_RDI + 0x1a0) = 0;
  *(undefined8 *)(in_RDI + 0x1a8) = 0;
  *(undefined8 *)(in_RDI + 0x1b0) = 0;
  *(undefined4 *)(in_RDI + 0x1b8) = 0;
  *(undefined4 *)(in_RDI + 0x1bc) = 0;
  QList<QGraphicsWidget_*>::QList((QList<QGraphicsWidget_*> *)0x9bff65);
  *(undefined8 *)(in_RDI + 0x1d8) = 0;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x9bff81);
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x9bff92);
  *(undefined8 *)(in_RDI + 0x210) = 0;
  *(undefined8 *)(in_RDI + 0x218) = 0;
  *(undefined4 *)(in_RDI + 0x220) = 0;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x9bffc3);
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x9bffd4);
  QPointF::QPointF((QPointF *)(in_RDI + 600));
  QMap<Qt::MouseButton,_QPointF>::QMap((QMap<Qt::MouseButton,_QPointF> *)0x9bfff6);
  QMap<Qt::MouseButton,_QPointF>::QMap((QMap<Qt::MouseButton,_QPointF> *)0x9c0007);
  QMap<Qt::MouseButton,_QPoint>::QMap((QMap<Qt::MouseButton,_QPoint> *)0x9c0018);
  QList<QGraphicsView_*>::QList((QList<QGraphicsView_*> *)0x9c0029);
  QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::QMultiMap
            ((QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *)0x9c003a);
  *(undefined8 *)(in_RDI + 0x2a0) = 0;
  QFont::QFont((QFont *)(in_RDI + 0x2a8));
  QPalette::QPalette((QPalette *)(in_RDI + 0x2b8));
  QStyleOptionGraphicsItem::QStyleOptionGraphicsItem((QStyleOptionGraphicsItem *)0x9c0078);
  QMap<int,_QEventPoint>::QMap((QMap<int,_QEventPoint> *)0x9c0089);
  QMap<int,_QGraphicsItem_*>::QMap((QMap<int,_QGraphicsItem_*> *)0x9c009a);
  QList<QGraphicsObject_*>::QList((QList<QGraphicsObject_*> *)0x9c00ab);
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::QHash
            ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)(in_RDI + 0x350));
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::QHash
            ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)(in_RDI + 0x358));
  QHash<QGesture_*,_QGraphicsObject_*>::QHash
            ((QHash<QGesture_*,_QGraphicsObject_*> *)(in_RDI + 0x360));
  QHash<Qt::GestureType,_int>::QHash((QHash<Qt::GestureType,_int> *)(in_RDI + 0x368));
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x9c0100);
  return;
}

Assistant:

QGraphicsScenePrivate::QGraphicsScenePrivate()
    : indexMethod(QGraphicsScene::BspTreeIndex),
      index(nullptr),
      lastItemCount(0),
      hasSceneRect(false),
      dirtyGrowingItemsBoundingRect(true),
      updateAll(false),
      calledEmitUpdated(false),
      processDirtyItemsEmitted(false),
      needSortTopLevelItems(true),
      holesInTopLevelSiblingIndex(false),
      topLevelSequentialOrdering(true),
      scenePosDescendantsUpdatePending(false),
      stickyFocus(false),
      hasFocus(false),
      lastMouseGrabberItemHasImplicitMouseGrab(false),
      allItemsIgnoreHoverEvents(true),
      allItemsUseDefaultCursor(true),
      painterStateProtection(true),
      sortCacheEnabled(false),
      allItemsIgnoreTouchEvents(true),
      focusOnTouch(true),
      minimumRenderSize(0.0),
      selectionChanging(0),
      rectAdjust(2),
      focusItem(nullptr),
      lastFocusItem(nullptr),
      passiveFocusItem(nullptr),
      tabFocusFirst(nullptr),
      activePanel(nullptr),
      lastActivePanel(nullptr),
      activationRefCount(0),
      childExplicitActivation(0),
      lastMouseGrabberItem(nullptr),
      dragDropItem(nullptr),
      enterWidget(nullptr),
      lastDropAction(Qt::IgnoreAction),
      style(nullptr)
{
}